

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::IsAnyMessage(Descriptor *descriptor,Options *options)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Descriptor *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  undefined1 uVar2;
  
  Descriptor::name_abi_cxx11_(in_RDI);
  bVar1 = std::operator==(in_RSI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                  in_stack_ffffffffffffffe8));
  uVar2 = false;
  if (bVar1) {
    Descriptor::file(in_RDI);
    uVar2 = IsAnyMessage((FileDescriptor *)in_RSI,
                         (Options *)CONCAT17(uVar2,in_stack_ffffffffffffffe8));
  }
  return (bool)uVar2;
}

Assistant:

bool IsAnyMessage(const Descriptor* descriptor, const Options& options) {
  return descriptor->name() == kAnyMessageName &&
         IsAnyMessage(descriptor->file(), options);
}